

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_getFrameHeader_advanced
                 (ZSTD_frameHeader *zfhPtr,void *src,size_t srcSize,ZSTD_format_e format)

{
  long lVar1;
  byte bVar2;
  size_t sVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  size_t toCopy;
  uchar hbuf [4];
  
  if (src == (void *)0x0 && srcSize != 0) {
    return 0xffffffffffffffff;
  }
  lVar1 = (ulong)(format == ZSTD_f_zstd1) * 4;
  uVar5 = lVar1 + 1;
  if (srcSize < uVar5) {
    if (format == ZSTD_f_zstd1_magicless || srcSize == 0) {
      return uVar5;
    }
    hbuf[0] = '(';
    hbuf[1] = 0xb5;
    hbuf[2] = '/';
    hbuf[3] = 0xfd;
    switchD_0193dc74::default(hbuf,src,srcSize);
    if (hbuf == (uchar  [4])0xfd2fb528) {
      return uVar5;
    }
    builtin_memcpy(hbuf,"P*M\x18",4);
    switchD_0193dc74::default(hbuf,src,srcSize);
    if (((uint)hbuf & 0xfffffff0) == 0x184d2a50) {
      return uVar5;
    }
  }
  else {
    zfhPtr->checksumFlag = 0;
    zfhPtr->_reserved1 = 0;
    *(undefined8 *)&zfhPtr->_reserved2 = 0;
    zfhPtr->blockSizeMax = 0;
    zfhPtr->frameType = ZSTD_frame;
    zfhPtr->headerSize = 0;
    zfhPtr->dictID = 0;
    zfhPtr->frameContentSize = 0;
    zfhPtr->windowSize = 0;
    if ((format == ZSTD_f_zstd1_magicless) || (*src == 0xfd2fb528)) {
      sVar3 = ZSTD_frameHeaderSize_internal(src,srcSize,format);
      if (srcSize < sVar3) {
        return sVar3;
      }
      zfhPtr->headerSize = (uint)sVar3;
      bVar2 = *(byte *)((long)src + lVar1);
      if ((bVar2 & 8) != 0) {
        return 0xfffffffffffffff2;
      }
      if ((bVar2 & 0x20) == 0) {
        if (0xaf < *(byte *)((long)src + uVar5)) {
          return 0xfffffffffffffff0;
        }
        uVar5 = lVar1 + 2;
      }
      bVar4 = bVar2 >> 2 & 1;
      uVar6 = (ulong)(bVar2 >> 6);
      switch(bVar2 & 3) {
      case 0:
        sVar3 = (*(code *)(&DAT_02186430 + *(int *)(&DAT_02186430 + uVar6 * 4)))();
        return sVar3;
      case 1:
        sVar3 = (*(code *)(&DAT_02186430 + *(int *)(&DAT_02186430 + uVar6 * 4)))
                          (&DAT_02186430,*(undefined1 *)((long)src + uVar5),bVar2,bVar4,
                           &DAT_02186430 + *(int *)(&DAT_02186430 + uVar6 * 4));
        return sVar3;
      case 2:
        sVar3 = (*(code *)(&DAT_02186430 + *(int *)(&DAT_02186430 + uVar6 * 4)))
                          (&DAT_02186430,*(undefined2 *)((long)src + uVar5),bVar2,bVar4,
                           &DAT_02186430 + *(int *)(&DAT_02186430 + uVar6 * 4));
        return sVar3;
      case 3:
        sVar3 = (*(code *)(&DAT_02186430 + *(int *)(&DAT_02186430 + uVar6 * 4)))
                          (&DAT_02186430,*(undefined4 *)((long)src + uVar5),bVar2,bVar4,
                           &DAT_02186430 + *(int *)(&DAT_02186430 + uVar6 * 4));
        return sVar3;
      }
    }
    if ((*src & 0xfffffff0) == 0x184d2a50) {
      if (srcSize < 8) {
        return 8;
      }
      zfhPtr->frameContentSize = (ulong)*(uint *)((long)src + 4);
      zfhPtr->frameType = ZSTD_skippableFrame;
      return 0;
    }
  }
  return 0xfffffffffffffff6;
}

Assistant:

size_t ZSTD_getFrameHeader_advanced(ZSTD_frameHeader* zfhPtr, const void* src, size_t srcSize, ZSTD_format_e format)
{
    const BYTE* ip = (const BYTE*)src;
    size_t const minInputSize = ZSTD_startingInputLength(format);

    DEBUGLOG(5, "ZSTD_getFrameHeader_advanced: minInputSize = %zu, srcSize = %zu", minInputSize, srcSize);

    if (srcSize > 0) {
        /* note : technically could be considered an assert(), since it's an invalid entry */
        RETURN_ERROR_IF(src==NULL, GENERIC, "invalid parameter : src==NULL, but srcSize>0");
    }
    if (srcSize < minInputSize) {
        if (srcSize > 0 && format != ZSTD_f_zstd1_magicless) {
            /* when receiving less than @minInputSize bytes,
             * control these bytes at least correspond to a supported magic number
             * in order to error out early if they don't.
            **/
            size_t const toCopy = MIN(4, srcSize);
            unsigned char hbuf[4]; MEM_writeLE32(hbuf, ZSTD_MAGICNUMBER);
            assert(src != NULL);
            ZSTD_memcpy(hbuf, src, toCopy);
            if ( MEM_readLE32(hbuf) != ZSTD_MAGICNUMBER ) {
                /* not a zstd frame : let's check if it's a skippable frame */
                MEM_writeLE32(hbuf, ZSTD_MAGIC_SKIPPABLE_START);
                ZSTD_memcpy(hbuf, src, toCopy);
                if ((MEM_readLE32(hbuf) & ZSTD_MAGIC_SKIPPABLE_MASK) != ZSTD_MAGIC_SKIPPABLE_START) {
                    RETURN_ERROR(prefix_unknown,
                                "first bytes don't correspond to any supported magic number");
        }   }   }
        return minInputSize;
    }

    ZSTD_memset(zfhPtr, 0, sizeof(*zfhPtr));   /* not strictly necessary, but static analyzers may not understand that zfhPtr will be read only if return value is zero, since they are 2 different signals */
    if ( (format != ZSTD_f_zstd1_magicless)
      && (MEM_readLE32(src) != ZSTD_MAGICNUMBER) ) {
        if ((MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
            /* skippable frame */
            if (srcSize < ZSTD_SKIPPABLEHEADERSIZE)
                return ZSTD_SKIPPABLEHEADERSIZE; /* magic number + frame length */
            ZSTD_memset(zfhPtr, 0, sizeof(*zfhPtr));
            zfhPtr->frameContentSize = MEM_readLE32((const char *)src + ZSTD_FRAMEIDSIZE);
            zfhPtr->frameType = ZSTD_skippableFrame;
            return 0;
        }
        RETURN_ERROR(prefix_unknown, "");
    }

    /* ensure there is enough `srcSize` to fully read/decode frame header */
    {   size_t const fhsize = ZSTD_frameHeaderSize_internal(src, srcSize, format);
        if (srcSize < fhsize) return fhsize;
        zfhPtr->headerSize = (U32)fhsize;
    }

    {   BYTE const fhdByte = ip[minInputSize-1];
        size_t pos = minInputSize;
        U32 const dictIDSizeCode = fhdByte&3;
        U32 const checksumFlag = (fhdByte>>2)&1;
        U32 const singleSegment = (fhdByte>>5)&1;
        U32 const fcsID = fhdByte>>6;
        U64 windowSize = 0;
        U32 dictID = 0;
        U64 frameContentSize = ZSTD_CONTENTSIZE_UNKNOWN;
        RETURN_ERROR_IF((fhdByte & 0x08) != 0, frameParameter_unsupported,
                        "reserved bits, must be zero");

        if (!singleSegment) {
            BYTE const wlByte = ip[pos++];
            U32 const windowLog = (wlByte >> 3) + ZSTD_WINDOWLOG_ABSOLUTEMIN;
            RETURN_ERROR_IF(windowLog > ZSTD_WINDOWLOG_MAX, frameParameter_windowTooLarge, "");
            windowSize = (1ULL << windowLog);
            windowSize += (windowSize >> 3) * (wlByte&7);
        }
        switch(dictIDSizeCode)
        {
            default:
                assert(0);  /* impossible */
                ZSTD_FALLTHROUGH;
            case 0 : break;
            case 1 : dictID = ip[pos]; pos++; break;
            case 2 : dictID = MEM_readLE16(ip+pos); pos+=2; break;
            case 3 : dictID = MEM_readLE32(ip+pos); pos+=4; break;
        }
        switch(fcsID)
        {
            default:
                assert(0);  /* impossible */
                ZSTD_FALLTHROUGH;
            case 0 : if (singleSegment) frameContentSize = ip[pos]; break;
            case 1 : frameContentSize = MEM_readLE16(ip+pos)+256; break;
            case 2 : frameContentSize = MEM_readLE32(ip+pos); break;
            case 3 : frameContentSize = MEM_readLE64(ip+pos); break;
        }
        if (singleSegment) windowSize = frameContentSize;

        zfhPtr->frameType = ZSTD_frame;
        zfhPtr->frameContentSize = frameContentSize;
        zfhPtr->windowSize = windowSize;
        zfhPtr->blockSizeMax = (unsigned) MIN(windowSize, ZSTD_BLOCKSIZE_MAX);
        zfhPtr->dictID = dictID;
        zfhPtr->checksumFlag = checksumFlag;
    }
    return 0;
}